

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_libpd.c
# Opt level: O3

int libpd_arraysize(char *name)

{
  int iVar1;
  t_symbol *s;
  _garray *x;
  
  sys_lock();
  s = gensym(name);
  x = (_garray *)pd_findbyclass(s,garray_class);
  if (x == (_garray *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = garray_npoints(x);
  }
  sys_unlock();
  return iVar1;
}

Assistant:

int libpd_arraysize(const char *name) {
  int retval;
  sys_lock();
  GETARRAY
  retval = garray_npoints(garray);
  sys_unlock();
  return retval;
}